

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteCamera(ColladaExporter *this,size_t pIndex)

{
  char *pcVar1;
  ostream *poVar2;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string cameraId;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string cameraName;
  aiCamera *cam;
  size_t pIndex_local;
  ColladaExporter *this_local;
  
  cameraName.field_2._8_8_ = this->mScene->mCameras[pIndex];
  pcVar1 = aiString::C_Str((aiString *)cameraName.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
  XMLEscape((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pcVar1 = aiString::C_Str((aiString *)cameraName.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar1,&local_b9);
  XMLIDEncode((string *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<camera id=\"");
  poVar2 = std::operator<<(poVar2,(string *)local_98);
  poVar2 = std::operator<<(poVar2,"-camera\" name=\"");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,"\" >");
  std::operator<<(poVar2,(string *)&this->endstr);
  PushTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<optics>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PushTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<technique_common>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PushTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<perspective>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PushTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<xfov sid=\"xfov\">");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,*(float *)(cameraName.field_2._8_8_ + 0x428) * 57.29578);
  poVar2 = std::operator<<(poVar2,"</xfov>");
  std::operator<<(poVar2,(string *)&this->endstr);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<aspect_ratio>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(cameraName.field_2._8_8_ + 0x434));
  poVar2 = std::operator<<(poVar2,"</aspect_ratio>");
  std::operator<<(poVar2,(string *)&this->endstr);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<znear sid=\"znear\">");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(cameraName.field_2._8_8_ + 0x42c));
  poVar2 = std::operator<<(poVar2,"</znear>");
  std::operator<<(poVar2,(string *)&this->endstr);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<zfar sid=\"zfar\">");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(cameraName.field_2._8_8_ + 0x430));
  poVar2 = std::operator<<(poVar2,"</zfar>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"</perspective>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"</technique_common>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"</optics>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"</camera>");
  std::operator<<(poVar2,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void ColladaExporter::WriteCamera(size_t pIndex){

    const aiCamera *cam = mScene->mCameras[pIndex];
    const std::string cameraName = XMLEscape(cam->mName.C_Str());
    const std::string cameraId = XMLIDEncode(cam->mName.C_Str());

    mOutput << startstr << "<camera id=\"" << cameraId << "-camera\" name=\"" << cameraName << "\" >" << endstr;
    PushTag();
    mOutput << startstr << "<optics>" << endstr;
    PushTag();
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    //assimp doesn't support the import of orthographic cameras! se we write
    //always perspective
    mOutput << startstr << "<perspective>" << endstr;
    PushTag();
    mOutput << startstr << "<xfov sid=\"xfov\">"<<
                                AI_RAD_TO_DEG(cam->mHorizontalFOV)
                        <<"</xfov>" << endstr;
    mOutput << startstr << "<aspect_ratio>"
                        <<      cam->mAspect
                        << "</aspect_ratio>" << endstr;
    mOutput << startstr << "<znear sid=\"znear\">"
                        <<      cam->mClipPlaneNear
                        <<  "</znear>" << endstr;
    mOutput << startstr << "<zfar sid=\"zfar\">"
                        <<      cam->mClipPlaneFar
                        << "</zfar>" << endstr;
    PopTag();
    mOutput << startstr << "</perspective>" << endstr;
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;
    PopTag();
    mOutput << startstr << "</optics>" << endstr;
    PopTag();
    mOutput << startstr << "</camera>" << endstr;

}